

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

ByteCodeLabel __thiscall Js::ByteCodeWriter::DefineLabel(ByteCodeWriter *this)

{
  int iVar1;
  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_00;
  
  this_00 = this->m_labelOffsets;
  if ((this_00->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count !=
      0x7fffffff) {
    JsUtil::List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray(this_00,0);
    (this_00->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).buffer
    [(this_00->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count] =
         0xffffffff;
    iVar1 = (this_00->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).
            count;
    (this_00->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count =
         iVar1 + 1;
    return iVar1;
  }
  Throw::OutOfMemory();
}

Assistant:

ByteCodeLabel ByteCodeWriter::DefineLabel()
    {
#if defined(TARGET_64)
        if (m_labelOffsets->Count() == INT_MAX)
        {
            // Reach our limit
            Js::Throw::OutOfMemory();
        }
#else
        // 32-bit machine don't have enough address space to get to INT_MAX
        Assert(m_labelOffsets->Count() < INT_MAX);
#endif

        //
        // Allocate a new label:
        // - All label locations start as "undefined: -1".  Once the label's location is marked in
        //   the byte-code, this will be updated.
        //

        return (ByteCodeLabel)m_labelOffsets->Add(UINT_MAX);
    }